

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O2

Vec3 OpenSteer::RandomVectorInUnitRadiusSphere(void)

{
  Vec3 VVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Vec3 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_38.z = 0.0;
  do {
    fVar2 = frandom01();
    local_18 = CONCAT44(extraout_XMM0_Db,fVar2);
    fVar2 = frandom01();
    local_28 = CONCAT44(extraout_XMM0_Db_00,fVar2);
    fVar2 = frandom01();
    local_38.z = fVar2 + fVar2 + -1.0;
    local_38.y = (float)local_28 + (float)local_28 + -1.0;
    local_38.x = (float)local_18 + (float)local_18 + -1.0;
    fVar2 = Vec3::length(&local_38);
  } while (1.0 <= fVar2);
  VVar1.z = local_38.z;
  VVar1.x = local_38.x;
  VVar1.y = local_38.y;
  return VVar1;
}

Assistant:

OpenSteer::Vec3 
OpenSteer::RandomVectorInUnitRadiusSphere (void)
{
    Vec3 v;

    do
    {
        v.set ((frandom01()*2) - 1,
               (frandom01()*2) - 1,
               (frandom01()*2) - 1);
    }
    while (v.length() >= 1);

    return v;
}